

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall doctest::anon_unknown_14::XmlReporter::report_query(XmlReporter *this,QueryData *in)

{
  XmlWriter *name;
  string *psVar1;
  ContextOptions *pCVar2;
  undefined8 uVar3;
  _Base_ptr p_Var4;
  ulong uVar5;
  TestCaseData *file;
  uint i;
  allocator local_11e;
  allocator local_11d;
  allocator local_11c;
  allocator local_11b;
  allocator local_11a;
  allocator local_119;
  string *local_118;
  undefined1 local_110 [32];
  string local_f0;
  string local_d0 [32];
  XmlReporter *local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [32];
  string local_78;
  ostream *local_58;
  string local_50;
  
  (*(this->super_IReporter)._vptr_IReporter[1])();
  pCVar2 = this->opt;
  local_b0 = this;
  if (pCVar2->list_reporters == true) {
    getListeners();
    local_118 = (string *)&this->xml;
    psVar1 = (string *)(local_110 + 0x20);
    for (p_Var4 = getListeners::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &getListeners::data._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      std::__cxx11::string::string
                ((string *)(local_110 + 0x40),"Listener",
                 (allocator *)&((XmlWriter *)local_98)->m_indent);
      XmlWriter::scopedElement((XmlWriter *)(local_a8 + 0x10),local_118);
      std::__cxx11::string::string((string *)psVar1,"priority",(allocator *)&local_50);
      uVar3 = local_98._0_8_;
      XmlWriter::writeAttribute<int>((XmlWriter *)local_98._0_8_,psVar1,(int *)(p_Var4 + 1));
      std::__cxx11::string::string((string *)local_110,"name",(allocator *)local_a8);
      XmlWriter::writeAttribute<doctest::String>
                ((XmlWriter *)uVar3,(string *)local_110,(String *)&p_Var4[1]._M_parent);
      std::__cxx11::string::~string((string *)local_110);
      std::__cxx11::string::~string((string *)psVar1);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)(local_a8 + 0x10));
      std::__cxx11::string::~string((string *)(local_110 + 0x40));
    }
    getReporters();
    psVar1 = (string *)(local_110 + 0x20);
    for (p_Var4 = getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &getReporters::data._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      std::__cxx11::string::string
                ((string *)(local_110 + 0x40),"Reporter",
                 (allocator *)&((XmlWriter *)local_98)->m_indent);
      XmlWriter::scopedElement((XmlWriter *)(local_a8 + 0x10),local_118);
      std::__cxx11::string::string((string *)psVar1,"priority",(allocator *)&local_50);
      uVar3 = local_98._0_8_;
      XmlWriter::writeAttribute<int>((XmlWriter *)local_98._0_8_,psVar1,(int *)(p_Var4 + 1));
      std::__cxx11::string::string((string *)local_110,"name",(allocator *)local_a8);
      XmlWriter::writeAttribute<doctest::String>
                ((XmlWriter *)uVar3,(string *)local_110,(String *)&p_Var4[1]._M_parent);
      std::__cxx11::string::~string((string *)local_110);
      std::__cxx11::string::~string((string *)psVar1);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)(local_a8 + 0x10));
      std::__cxx11::string::~string((string *)(local_110 + 0x40));
    }
  }
  else {
    if ((pCVar2->count == false) && (pCVar2->list_test_cases != true)) {
      if (pCVar2->list_test_suites != true) goto LAB_0010e12f;
      name = &this->xml;
      psVar1 = (string *)(local_110 + 0x20);
      for (uVar5 = 0; uVar5 < in->num_data; uVar5 = uVar5 + 1) {
        std::__cxx11::string::string
                  ((string *)(local_110 + 0x40),"TestSuite",(allocator *)(local_a8 + 0x10));
        XmlWriter::scopedElement((XmlWriter *)local_110,(string *)name);
        std::__cxx11::string::string
                  ((string *)psVar1,"name",(allocator *)&((XmlWriter *)local_98)->m_indent);
        (anonymous_namespace)::XmlWriter::ScopedElement::writeAttribute<char_const*>
                  ((ScopedElement *)local_110,psVar1,&in->data[uVar5]->m_test_suite);
        std::__cxx11::string::~string((string *)psVar1);
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_110);
        std::__cxx11::string::~string((string *)(local_110 + 0x40));
      }
      std::__cxx11::string::string
                ((string *)(local_110 + 0x40),"OverallResultsTestCases",
                 (allocator *)(local_a8 + 0x10));
      XmlWriter::scopedElement((XmlWriter *)local_110,(string *)name);
      std::__cxx11::string::string
                ((string *)(local_110 + 0x20),"unskipped",
                 (allocator *)&((XmlWriter *)local_98)->m_indent);
      XmlWriter::writeAttribute<unsigned_int>
                ((XmlWriter *)local_110._0_8_,(string *)(local_110 + 0x20),
                 &in->run_stats->numTestCasesPassingFilters);
      std::__cxx11::string::~string((string *)(local_110 + 0x20));
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_110);
      std::__cxx11::string::~string((string *)(local_110 + 0x40));
      std::__cxx11::string::string
                ((string *)(local_110 + 0x40),"OverallResultsTestSuites",
                 (allocator *)(local_a8 + 0x10));
      XmlWriter::scopedElement((XmlWriter *)local_110,(string *)name);
      std::__cxx11::string::string
                ((string *)(local_110 + 0x20),"unskipped",
                 (allocator *)&((XmlWriter *)local_98)->m_indent);
      XmlWriter::writeAttribute<unsigned_int>
                ((XmlWriter *)local_110._0_8_,(string *)(local_110 + 0x20),
                 &in->run_stats->numTestSuitesPassingFilters);
    }
    else {
      local_118 = (string *)&this->xml;
      psVar1 = &((XmlWriter *)local_98)->m_indent;
      for (uVar5 = 0; uVar5 < in->num_data; uVar5 = uVar5 + 1) {
        std::__cxx11::string::string((string *)(local_110 + 0x40),"TestCase",&local_119);
        XmlWriter::scopedElement((XmlWriter *)local_a8,local_118);
        std::__cxx11::string::string((string *)(local_110 + 0x20),"name",&local_11a);
        (anonymous_namespace)::XmlWriter::ScopedElement::writeAttribute<char_const*>
                  ((ScopedElement *)local_a8,(string *)(local_110 + 0x20),&in->data[uVar5]->m_name);
        std::__cxx11::string::string((string *)local_110,"testsuite",&local_11b);
        (anonymous_namespace)::XmlWriter::ScopedElement::writeAttribute<char_const*>
                  ((ScopedElement *)local_a8,(string *)local_110,&in->data[uVar5]->m_test_suite);
        std::__cxx11::string::string((string *)(local_a8 + 0x10),"filename",&local_11c);
        file = in->data[uVar5];
        if ((file->m_file).field_0.buf[0x17] < '\0') {
          file = (TestCaseData *)(file->m_file).field_0.data.ptr;
        }
        local_58 = (ostream *)skipPathFromFilename((char *)file);
        (anonymous_namespace)::XmlWriter::ScopedElement::writeAttribute<char_const*>
                  ((ScopedElement *)local_a8,(string *)(local_a8 + 0x10),
                   (char **)&((XmlWriter *)local_98)->m_os);
        std::__cxx11::string::string((string *)psVar1,"line",&local_11d);
        local_a8._12_4_ = 0;
        if (local_b0->opt->no_line_numbers == false) {
          local_a8._12_4_ = in->data[uVar5]->m_line;
        }
        XmlWriter::ScopedElement::writeAttribute<unsigned_int>
                  ((ScopedElement *)local_a8,psVar1,(uint *)(local_a8 + 0xc));
        std::__cxx11::string::string((string *)&local_50,"skipped",&local_11e);
        XmlWriter::ScopedElement::writeAttribute<bool>
                  ((ScopedElement *)local_a8,&local_50,&in->data[uVar5]->m_skip);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)psVar1);
        std::__cxx11::string::~string((string *)(local_a8 + 0x10));
        std::__cxx11::string::~string((string *)local_110);
        std::__cxx11::string::~string((string *)(local_110 + 0x20));
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a8);
        std::__cxx11::string::~string((string *)(local_110 + 0x40));
      }
      std::__cxx11::string::string
                ((string *)(local_110 + 0x40),"OverallResultsTestCases",
                 (allocator *)(local_a8 + 0x10));
      XmlWriter::scopedElement((XmlWriter *)local_110,local_118);
      std::__cxx11::string::string
                ((string *)(local_110 + 0x20),"unskipped",
                 (allocator *)&((XmlWriter *)local_98)->m_indent);
      XmlWriter::writeAttribute<unsigned_int>
                ((XmlWriter *)local_110._0_8_,(string *)(local_110 + 0x20),
                 &in->run_stats->numTestCasesPassingFilters);
    }
    std::__cxx11::string::~string((string *)(local_110 + 0x20));
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_110);
    std::__cxx11::string::~string((string *)(local_110 + 0x40));
  }
LAB_0010e12f:
  XmlWriter::endElement(&local_b0->xml);
  return;
}

Assistant:

void report_query(const QueryData& in) override {
            test_run_start();
            if(opt.list_reporters) {
                for(auto& curr : getListeners())
                    xml.scopedElement("Listener")
                            .writeAttribute("priority", curr.first.first)
                            .writeAttribute("name", curr.first.second);
                for(auto& curr : getReporters())
                    xml.scopedElement("Reporter")
                            .writeAttribute("priority", curr.first.first)
                            .writeAttribute("name", curr.first.second);
            } else if(opt.count || opt.list_test_cases) {
                for(unsigned i = 0; i < in.num_data; ++i) {
                    xml.scopedElement("TestCase").writeAttribute("name", in.data[i]->m_name)
                        .writeAttribute("testsuite", in.data[i]->m_test_suite)
                        .writeAttribute("filename", skipPathFromFilename(in.data[i]->m_file.c_str()))
                        .writeAttribute("line", line(in.data[i]->m_line))
                        .writeAttribute("skipped", in.data[i]->m_skip);
                }
                xml.scopedElement("OverallResultsTestCases")
                        .writeAttribute("unskipped", in.run_stats->numTestCasesPassingFilters);
            } else if(opt.list_test_suites) {
                for(unsigned i = 0; i < in.num_data; ++i)
                    xml.scopedElement("TestSuite").writeAttribute("name", in.data[i]->m_test_suite);
                xml.scopedElement("OverallResultsTestCases")
                        .writeAttribute("unskipped", in.run_stats->numTestCasesPassingFilters);
                xml.scopedElement("OverallResultsTestSuites")
                        .writeAttribute("unskipped", in.run_stats->numTestSuitesPassingFilters);
            }
            xml.endElement();
        }